

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<double> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  ImDrawIdx IVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pGVar7 = this->Getter;
  iVar3 = pGVar7->Count;
  iVar4 = this->Transformer->YAxis;
  fVar15 = (float)((((double)(prim + 1) * pGVar7->XScale + pGVar7->X0) -
                   (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[iVar4].Min.x);
  fVar16 = (float)((*(double *)
                     ((long)pGVar7->Ys +
                     (long)(((prim + 1 + pGVar7->Offset) % iVar3 + iVar3) % iVar3) *
                     (long)pGVar7->Stride) - GImPlot->CurrentPlot->YAxis[iVar4].Range.Min) *
                   GImPlot->My[iVar4] + (double)GImPlot->PixelRange[iVar4].Min.y);
  fVar14 = (this->P1).x;
  fVar17 = (this->P1).y;
  fVar13 = fVar17;
  if (fVar16 <= fVar17) {
    fVar13 = fVar16;
  }
  bVar11 = false;
  if ((fVar13 < (cull_rect->Max).y) &&
     (fVar13 = (float)(-(uint)(fVar16 <= fVar17) & (uint)fVar17 |
                      ~-(uint)(fVar16 <= fVar17) & (uint)fVar16), pfVar1 = &(cull_rect->Min).y,
     bVar11 = false, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
    fVar13 = fVar14;
    if (fVar15 <= fVar14) {
      fVar13 = fVar15;
    }
    if (fVar13 < (cull_rect->Max).x) {
      fVar13 = (float)(~-(uint)(fVar15 <= fVar14) & (uint)fVar15 |
                      -(uint)(fVar15 <= fVar14) & (uint)fVar14);
      bVar11 = (cull_rect->Min).x <= fVar13 && fVar13 != (cull_rect->Min).x;
    }
  }
  if (bVar11 != false) {
    fVar13 = this->Weight;
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar14 = fVar15 - fVar14;
    fVar17 = fVar16 - fVar17;
    fVar12 = fVar14 * fVar14 + fVar17 * fVar17;
    if (0.0 < fVar12) {
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      fVar14 = fVar14 * (1.0 / fVar12);
      fVar17 = fVar17 * (1.0 / fVar12);
    }
    fVar13 = fVar13 * 0.5;
    fVar14 = fVar14 * fVar13;
    fVar13 = fVar13 * fVar17;
    pIVar8 = DrawList->_VtxWritePtr;
    (pIVar8->pos).x = (this->P1).x + fVar13;
    (pIVar8->pos).y = (this->P1).y - fVar14;
    pIVar8->uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar5;
    pIVar8[1].pos.x = fVar13 + fVar15;
    pIVar8[1].pos.y = fVar16 - fVar14;
    pIVar8[1].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar5;
    pIVar8[2].pos.x = fVar15 - fVar13;
    pIVar8[2].pos.y = fVar14 + fVar16;
    pIVar8[2].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar5;
    pIVar8[3].pos.x = (this->P1).x - fVar13;
    pIVar8[3].pos.y = fVar14 + (this->P1).y;
    pIVar8[3].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar10 = (ImDrawIdx)uVar6;
    *pIVar9 = IVar10;
    pIVar9[1] = IVar10 + 1;
    pIVar9[2] = IVar10 + 2;
    pIVar9[3] = IVar10;
    pIVar9[4] = IVar10 + 2;
    pIVar9[5] = IVar10 + 3;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar2.y = fVar16;
  IVar2.x = fVar15;
  this->P1 = IVar2;
  return bVar11;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }